

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_inst.c
# Opt level: O0

uint32 get_import_func_count(module *m)

{
  uint local_18;
  uint32 local_14;
  uint32 i;
  uint32 count;
  module *m_local;
  
  local_14 = 0;
  for (local_18 = 0; local_18 < (m->import_sec).import_segment_count; local_18 = local_18 + 1) {
    if ((m->import_sec).import_segment_addr[local_18].im_desc.tag == '\0') {
      local_14 = local_14 + 1;
    }
  }
  return local_14;
}

Assistant:

uint32 get_import_func_count(module *m) {
    uint32 count = 0;
    for (uint32 i = 0; i < m->import_sec.import_segment_count; i++) {
        if ((m->import_sec.import_segment_addr + i)->im_desc.tag == func_im_export_tag)
            count++;
    }
    return count;
}